

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_matcher.cpp
# Opt level: O0

idx_t duckdb::StructMatchEquality<true,duckdb::Equals>
                (Vector *lhs_vector,TupleDataVectorFormat *lhs_format,SelectionVector *sel,
                idx_t count,TupleDataLayout *rhs_layout,Vector *rhs_row_locations,idx_t col_idx,
                vector<duckdb::MatchFunction,_true> *child_functions,SelectionVector *no_match_sel,
                idx_t *no_match_count)

{
  value_type vVar1;
  bool bVar2;
  uchar *entry;
  const_reference pvVar3;
  uchar **ppuVar4;
  idx_t iVar5;
  TupleDataLayout *pTVar6;
  Vector *pVVar7;
  type pVVar8;
  const_reference pvVar9;
  const_reference pvVar10;
  ulong in_RCX;
  SelectionVector *in_RDX;
  long in_RSI;
  TupleDataLayout *in_R8;
  idx_t in_stack_00000008;
  SelectionVector *in_stack_00000018;
  idx_t *in_stack_00000020;
  value_type *child_function;
  value_type *lhs_struct_format;
  Vector *lhs_struct_vector;
  idx_t struct_col_idx;
  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
  *lhs_struct_vectors;
  TupleDataLayout *rhs_struct_layout;
  idx_t idx_1;
  idx_t i_1;
  uchar **rhs_struct_locations;
  value_type rhs_offset_in_row;
  Vector rhs_struct_row_locations;
  bool rhs_null;
  ValidityBytes rhs_mask;
  uchar **rhs_location;
  bool lhs_null;
  idx_t lhs_idx;
  idx_t idx;
  idx_t i;
  idx_t match_count;
  idx_t idx_in_entry;
  idx_t entry_idx;
  uchar **rhs_locations;
  ValidityMask *lhs_validity;
  SelectionVector *lhs_sel;
  Vector *in_stack_fffffffffffffdc8;
  TupleDataLayout *in_stack_fffffffffffffdd0;
  TemplatedValidityMask<unsigned_long> *in_stack_fffffffffffffdd8;
  TemplatedValidityMask<unsigned_char> *in_stack_fffffffffffffde0;
  undefined8 in_stack_fffffffffffffde8;
  LogicalType *in_stack_fffffffffffffdf0;
  idx_t in_stack_fffffffffffffe00;
  LogicalType *in_stack_fffffffffffffe08;
  Vector *in_stack_fffffffffffffe10;
  byte local_1a1;
  Vector *local_188;
  ulong local_168;
  Vector local_128;
  byte local_b9;
  TemplatedValidityMask<unsigned_char> local_b8;
  uchar **local_98;
  byte local_89;
  idx_t local_88;
  idx_t local_80;
  ulong local_78;
  ulong local_70;
  idx_t local_68;
  idx_t local_60;
  uchar **local_58;
  TemplatedValidityMask<unsigned_long> *local_50;
  SelectionVector *local_48;
  TupleDataLayout *local_38;
  ulong local_30;
  SelectionVector *local_28;
  
  local_48 = *(SelectionVector **)(in_RSI + 0x20);
  local_50 = (TemplatedValidityMask<unsigned_long> *)(in_RSI + 0x30);
  local_38 = in_R8;
  local_30 = in_RCX;
  local_28 = in_RDX;
  local_58 = FlatVector::GetData<unsigned_char*>((Vector *)0x15cbe93);
  TemplatedValidityMask<unsigned_char>::GetEntryIndex(in_stack_00000008,&local_60,&local_68);
  local_70 = 0;
  for (local_78 = 0; local_78 < local_30; local_78 = local_78 + 1) {
    local_80 = SelectionVector::get_index(local_28,local_78);
    local_88 = SelectionVector::get_index(local_48,local_80);
    bVar2 = TemplatedValidityMask<unsigned_long>::AllValid(local_50);
    if (bVar2) {
      local_1a1 = 0;
    }
    else {
      bVar2 = TemplatedValidityMask<unsigned_long>::RowIsValid
                        (in_stack_fffffffffffffdd8,(idx_t)in_stack_fffffffffffffdd0);
      local_1a1 = bVar2 ^ 0xff;
    }
    local_89 = local_1a1 & 1;
    local_98 = local_58 + local_80;
    TupleDataLayout::ColumnCount((TupleDataLayout *)0x15cbfab);
    TemplatedValidityMask<unsigned_char>::TemplatedValidityMask
              (in_stack_fffffffffffffde0,(uchar *)in_stack_fffffffffffffdd8,
               (idx_t)in_stack_fffffffffffffdd0);
    entry = TemplatedValidityMask<unsigned_char>::GetValidityEntryUnsafe(&local_b8,local_60);
    bVar2 = TemplatedValidityMask<unsigned_char>::RowIsValid(entry,&local_68);
    local_b9 = (bVar2 ^ 0xffU) & 1;
    if (((local_89 & 1) != 0) || (bVar2 = true, local_b9 != 0)) {
      bVar2 = false;
    }
    if (bVar2) {
      local_70 = local_70 + 1;
      SelectionVector::set_index
                ((SelectionVector *)in_stack_fffffffffffffde0,(idx_t)in_stack_fffffffffffffdd8,
                 (idx_t)in_stack_fffffffffffffdd0);
    }
    else {
      *in_stack_00000020 = *in_stack_00000020 + 1;
      SelectionVector::set_index
                ((SelectionVector *)in_stack_fffffffffffffde0,(idx_t)in_stack_fffffffffffffdd8,
                 (idx_t)in_stack_fffffffffffffdd0);
    }
    TemplatedValidityMask<unsigned_char>::~TemplatedValidityMask
              ((TemplatedValidityMask<unsigned_char> *)0x15cc08d);
  }
  LogicalType::LogicalType
            (in_stack_fffffffffffffdf0,(LogicalTypeId)((ulong)in_stack_fffffffffffffde8 >> 0x38));
  Vector::Vector(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,in_stack_fffffffffffffe00);
  LogicalType::~LogicalType((LogicalType *)0x15cc0e3);
  TupleDataLayout::GetOffsets(local_38);
  pvVar3 = vector<unsigned_long,_true>::operator[]
                     ((vector<unsigned_long,_true> *)in_stack_fffffffffffffdd0,
                      (size_type)in_stack_fffffffffffffdc8);
  vVar1 = *pvVar3;
  ppuVar4 = FlatVector::GetData<unsigned_char*>((Vector *)0x15cc124);
  for (local_168 = 0; local_168 < local_70; local_168 = local_168 + 1) {
    iVar5 = SelectionVector::get_index(local_28,local_168);
    ppuVar4[iVar5] = local_58[iVar5] + vVar1;
  }
  pTVar6 = TupleDataLayout::GetStructLayout
                     (in_stack_fffffffffffffdd0,(idx_t)in_stack_fffffffffffffdc8);
  StructVector::GetEntries(in_stack_fffffffffffffdc8);
  local_188 = (Vector *)0x0;
  while( true ) {
    pVVar7 = (Vector *)TupleDataLayout::ColumnCount((TupleDataLayout *)0x15cc279);
    if (pVVar7 <= local_188) break;
    vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>::
    operator[]((vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
                *)in_stack_fffffffffffffdd0,(size_type)in_stack_fffffffffffffdc8);
    pVVar8 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                       ((unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true> *)
                        in_stack_fffffffffffffdd0);
    pvVar9 = vector<duckdb::TupleDataVectorFormat,_true>::operator[]
                       ((vector<duckdb::TupleDataVectorFormat,_true> *)in_stack_fffffffffffffdd0,
                        (size_type)in_stack_fffffffffffffdc8);
    pvVar10 = vector<duckdb::MatchFunction,_true>::operator[]
                        ((vector<duckdb::MatchFunction,_true> *)in_stack_fffffffffffffdd0,
                         (size_type)in_stack_fffffffffffffdc8);
    in_stack_fffffffffffffdd0 = (TupleDataLayout *)&pvVar10->child_functions;
    in_stack_fffffffffffffdc8 = local_188;
    local_70 = (*pvVar10->function)
                         (pVVar8,pvVar9,local_28,local_70,pTVar6,&local_128,(idx_t)local_188,
                          (vector<duckdb::MatchFunction,_true> *)in_stack_fffffffffffffdd0,
                          in_stack_00000018,in_stack_00000020);
    local_188 = (Vector *)&local_188->field_0x1;
  }
  Vector::~Vector((Vector *)in_stack_fffffffffffffdd0);
  return local_70;
}

Assistant:

static idx_t StructMatchEquality(Vector &lhs_vector, const TupleDataVectorFormat &lhs_format, SelectionVector &sel,
                                 const idx_t count, const TupleDataLayout &rhs_layout, Vector &rhs_row_locations,
                                 const idx_t col_idx, const vector<MatchFunction> &child_functions,
                                 SelectionVector *no_match_sel, idx_t &no_match_count) {
	using COMPARISON_OP = ComparisonOperationWrapper<OP>;

	// LHS
	const auto &lhs_sel = *lhs_format.unified.sel;
	const auto &lhs_validity = lhs_format.unified.validity;

	// RHS
	const auto rhs_locations = FlatVector::GetData<data_ptr_t>(rhs_row_locations);
	idx_t entry_idx;
	idx_t idx_in_entry;
	ValidityBytes::GetEntryIndex(col_idx, entry_idx, idx_in_entry);

	idx_t match_count = 0;
	for (idx_t i = 0; i < count; i++) {
		const auto idx = sel.get_index(i);

		const auto lhs_idx = lhs_sel.get_index(idx);
		const auto lhs_null = lhs_validity.AllValid() ? false : !lhs_validity.RowIsValid(lhs_idx);

		const auto &rhs_location = rhs_locations[idx];
		const ValidityBytes rhs_mask(rhs_location, rhs_layout.ColumnCount());
		const auto rhs_null = !rhs_mask.RowIsValid(rhs_mask.GetValidityEntryUnsafe(entry_idx), idx_in_entry);

		// For structs there is no value to compare, here we match NULLs and let recursion do the rest
		// So we use the comparison only if rhs or LHS is NULL and COMPARE_NULL is true
		if (!(lhs_null || rhs_null) ||
		    (COMPARISON_OP::COMPARE_NULL && COMPARISON_OP::template Operation<uint32_t>(0, 0, lhs_null, rhs_null))) {
			sel.set_index(match_count++, idx);
		} else if (NO_MATCH_SEL) {
			no_match_sel->set_index(no_match_count++, idx);
		}
	}

	// Create a Vector of pointers to the start of the TupleDataLayout of the STRUCT
	Vector rhs_struct_row_locations(LogicalType::POINTER);
	const auto rhs_offset_in_row = rhs_layout.GetOffsets()[col_idx];
	auto rhs_struct_locations = FlatVector::GetData<data_ptr_t>(rhs_struct_row_locations);
	for (idx_t i = 0; i < match_count; i++) {
		const auto idx = sel.get_index(i);
		rhs_struct_locations[idx] = rhs_locations[idx] + rhs_offset_in_row;
	}

	// Get the struct layout and struct entries
	const auto &rhs_struct_layout = rhs_layout.GetStructLayout(col_idx);
	auto &lhs_struct_vectors = StructVector::GetEntries(lhs_vector);
	D_ASSERT(rhs_struct_layout.ColumnCount() == lhs_struct_vectors.size());

	for (idx_t struct_col_idx = 0; struct_col_idx < rhs_struct_layout.ColumnCount(); struct_col_idx++) {
		auto &lhs_struct_vector = *lhs_struct_vectors[struct_col_idx];
		auto &lhs_struct_format = lhs_format.children[struct_col_idx];
		const auto &child_function = child_functions[struct_col_idx];
		match_count = child_function.function(lhs_struct_vector, lhs_struct_format, sel, match_count, rhs_struct_layout,
		                                      rhs_struct_row_locations, struct_col_idx, child_function.child_functions,
		                                      no_match_sel, no_match_count);
	}

	return match_count;
}